

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path_builder.cc
# Opt level: O0

void __thiscall
bssl::anon_unknown_6::CertIssuersIter::AddIssuers
          (CertIssuersIter *this,ParsedCertificateList *new_issuers)

{
  TrustStore *pTVar1;
  bool bVar2;
  int iVar3;
  element_type *peVar4;
  element_type *peVar5;
  undefined4 extraout_var;
  ParsedCertificate *target;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  pair<std::__detail::_Node_iterator<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>,_bool>
  pVar6;
  Span<const_unsigned_char> b;
  Span<const_unsigned_char> b_00;
  undefined1 local_d8 [8];
  IssuerEntry entry;
  Span<const_unsigned_char> local_a8;
  bssl *local_98;
  uchar *local_90;
  string_view local_88;
  _Node_iterator_base<std::basic_string_view<char,_std::char_traits<char>_>,_true> local_78;
  Span<const_unsigned_char> local_70;
  bssl *local_60;
  uchar *local_58;
  string_view local_50;
  _Node_iterator_base<std::basic_string_view<char,_std::char_traits<char>_>,_true> local_40;
  __shared_ptr_access<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *local_38;
  shared_ptr<const_bssl::ParsedCertificate> *issuer;
  iterator __end2;
  iterator __begin2;
  ParsedCertificateList *__range2;
  ParsedCertificateList *new_issuers_local;
  CertIssuersIter *this_local;
  
  __end2 = ::std::
           vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
           ::begin(new_issuers);
  issuer = (shared_ptr<const_bssl::ParsedCertificate> *)
           ::std::
           vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
           ::end(new_issuers);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<std::shared_ptr<const_bssl::ParsedCertificate>_*,_std::vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>_>
                                     *)&issuer), bVar2) {
    local_38 = (__shared_ptr_access<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)__gnu_cxx::
                  __normal_iterator<std::shared_ptr<const_bssl::ParsedCertificate>_*,_std::vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>_>
                  ::operator*(&__end2);
    peVar4 = ::std::
             __shared_ptr_access<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(local_38);
    local_70 = (Span<const_unsigned_char>)ParsedCertificate::der_cert(peVar4);
    Span<unsigned_char_const>::Span<bssl::der::Input,void,bssl::der::Input>
              ((Span<unsigned_char_const> *)&local_60,(Input *)&local_70);
    b.size_ = extraout_RDX;
    b.data_ = local_58;
    local_50 = BytesAsStringView(local_60,b);
    local_40._M_cur =
         (__node_type *)
         ::std::
         unordered_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
         ::find(&this->present_issuers_,&local_50);
    local_78._M_cur =
         (__node_type *)
         ::std::
         unordered_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
         ::end(&this->present_issuers_);
    bVar2 = ::std::__detail::operator!=(&local_40,&local_78);
    if (!bVar2) {
      peVar4 = ::std::
               __shared_ptr_access<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(local_38);
      local_a8 = (Span<const_unsigned_char>)ParsedCertificate::der_cert(peVar4);
      Span<unsigned_char_const>::Span<bssl::der::Input,void,bssl::der::Input>
                ((Span<unsigned_char_const> *)&local_98,(Input *)&local_a8);
      b_00.size_ = extraout_RDX_00;
      b_00.data_ = local_90;
      local_88 = BytesAsStringView(local_98,b_00);
      pVar6 = ::std::
              unordered_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              ::insert(&this->present_issuers_,&local_88);
      entry._24_8_ = pVar6.first.
                     super__Node_iterator_base<std::basic_string_view<char,_std::char_traits<char>_>,_true>
                     ._M_cur;
      IssuerEntry::IssuerEntry((IssuerEntry *)local_d8);
      ::std::shared_ptr<const_bssl::ParsedCertificate>::operator=
                ((shared_ptr<const_bssl::ParsedCertificate> *)local_d8,
                 (shared_ptr<const_bssl::ParsedCertificate> *)local_38);
      pTVar1 = this->trust_store_;
      peVar5 = ::std::__shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>::get
                         ((__shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2> *
                          )local_d8);
      iVar3 = (*(pTVar1->super_CertIssuerSource)._vptr_CertIssuerSource[4])(pTVar1,peVar5);
      entry.cert.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(extraout_var,iVar3);
      target = cert(this);
      peVar5 = ::std::__shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>::get
                         ((__shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2> *
                          )local_d8);
      entry.trust.type =
           TrustAndKeyIdentifierMatchToOrder
                     (target,peVar5,
                      (CertificateTrust *)
                      &entry.cert.
                       super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount);
      ::std::
      vector<bssl::(anonymous_namespace)::IssuerEntry,_std::allocator<bssl::(anonymous_namespace)::IssuerEntry>_>
      ::push_back(&this->issuers_,(value_type *)local_d8);
      this->issuers_needs_sort_ = true;
      IssuerEntry::~IssuerEntry((IssuerEntry *)local_d8);
    }
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<const_bssl::ParsedCertificate>_*,_std::vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void CertIssuersIter::AddIssuers(ParsedCertificateList new_issuers) {
  for (std::shared_ptr<const ParsedCertificate> &issuer : new_issuers) {
    if (present_issuers_.find(BytesAsStringView(issuer->der_cert())) !=
        present_issuers_.end()) {
      continue;
    }
    present_issuers_.insert(BytesAsStringView(issuer->der_cert()));

    // Look up the trust for this issuer.
    IssuerEntry entry;
    entry.cert = std::move(issuer);
    entry.trust = trust_store_->GetTrust(entry.cert.get());
    entry.trust_and_key_id_match_ordering = TrustAndKeyIdentifierMatchToOrder(
        cert(), entry.cert.get(), entry.trust);

    issuers_.push_back(std::move(entry));
    issuers_needs_sort_ = true;
  }
}